

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O1

bool __thiscall
Inferences::InductionClauseIterator::notDoneInt
          (InductionClauseIterator *this,InductionContext *context,Literal *bound1,Literal *bound2,
          Entry **e)

{
  uint uVar1;
  bool bVar2;
  TermList arg1;
  Literal *bound1_00;
  Literal *bound2_00;
  TermList arg1_00;
  Term *pTVar3;
  uint uVar4;
  TermList arg2;
  
  bound1_00 = (Literal *)0x0;
  arg2._content = (uint64_t)e;
  arg1._content = (uint64_t)getPlaceholderForTerm(&context->_indTerms,0);
  if (bound1 != (Literal *)0x0) {
    uVar1 = (uint)(bound1->super_Term)._args[0]._content;
    uVar4 = uVar1 >> 2;
    pTVar3 = (Term *)arg1._content;
    if ((uVar1 >> 2 & 1) != 0) {
      pTVar3 = (Term *)(bound1->super_Term)._args
                       [*(uint *)&(bound1->super_Term).field_0xc & 0xfffffff]._content;
    }
    arg1_00._content = arg1._content;
    if ((uVar4 & 1) == 0) {
      arg1_00._content =
           (bound1->super_Term)._args
           [(ulong)(*(uint *)&(bound1->super_Term).field_0xc & 0xfffffff) - 1]._content;
    }
    bound1_00 = Kernel::Literal::create2
                          ((Literal *)(ulong)(bound1->super_Term)._functor,uVar4 & 1,SUB81(pTVar3,0)
                           ,arg1_00,arg2);
  }
  if (bound2 == (Literal *)0x0) {
    bound2_00 = (Literal *)0x0;
  }
  else {
    uVar1 = (uint)(bound2->super_Term)._args[0]._content;
    uVar4 = uVar1 >> 2;
    pTVar3 = (Term *)arg1._content;
    if ((uVar1 >> 2 & 1) == 0) {
      pTVar3 = (Term *)(bound2->super_Term)._args
                       [*(uint *)&(bound2->super_Term).field_0xc & 0xfffffff]._content;
    }
    if ((uVar4 & 1) != 0) {
      arg1._content =
           (bound2->super_Term)._args
           [(ulong)(*(uint *)&(bound2->super_Term).field_0xc & 0xfffffff) - 1]._content;
    }
    bound2_00 = Kernel::Literal::create2
                          ((Literal *)(ulong)(bound2->super_Term)._functor,uVar4 & 1,SUB81(pTVar3,0)
                           ,arg1,arg2);
  }
  bVar2 = Indexing::InductionFormulaIndex::findOrInsert
                    (this->_formulaIndex,context,e,bound1_00,bound2_00);
  return bVar2;
}

Assistant:

bool InductionClauseIterator::notDoneInt(InductionContext context, Literal* bound1, Literal* bound2, InductionFormulaIndex::Entry*& e)
{
  ASS_EQ(context._indTerms.size(), 1);
  TermList ph(getPlaceholderForTerm(context._indTerms,0));
  Literal* b1 = nullptr;
  Literal* b2 = nullptr;
  if (bound1) {
    b1 = Literal::create2(bound1->functor(), bound1->polarity(),
      bound1->polarity() ? *bound1->nthArgument(0) : ph,
      bound1->polarity() ? ph : *bound1->nthArgument(1));
  }
  if (bound2) {
    b2 = Literal::create2(bound2->functor(), bound2->polarity(),
      bound2->polarity() ? ph : *bound2->nthArgument(0),
      bound2->polarity() ? *bound2->nthArgument(1) : ph);
  }
  return _formulaIndex.findOrInsert(context, e, b1, b2);
}